

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void __thiscall
CustomUintFormatter<6,false>::Ser<VectorWriter,unsigned_long>
          (CustomUintFormatter<6,_false> *this,VectorWriter *s,unsigned_long v)

{
  long lVar1;
  Span<unsigned_long> s_00;
  char *pcVar2;
  size_t in_RCX;
  ulong in_RDX;
  Span<const_std::byte> *in_RSI;
  long in_FS_OFFSET;
  Span<const_std::byte> SVar3;
  uint64_t raw;
  size_t in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  io_errc in_stack_ffffffffffffff64;
  error_code *in_stack_ffffffffffffff68;
  unsigned_long *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  char *pcVar4;
  void *local_70;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDX < 0x1000000000000) {
    htole64_internal(in_stack_ffffffffffffff58);
    Span<unsigned_long>::Span<unsigned_long,_0>
              ((Span<unsigned_long> *)in_RSI,
               (unsigned_long *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
    s_00.m_size = in_stack_ffffffffffffff78;
    s_00.m_data = in_stack_ffffffffffffff70;
    AsBytes<unsigned_long>(s_00);
    SVar3 = Span<const_std::byte>::first
                      (in_RSI,CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    local_70 = (void *)SVar3.m_size;
    VectorWriter::write((VectorWriter *)in_RSI,(int)SVar3.m_data,local_70,in_RCX);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else {
    pcVar2 = (char *)__cxa_allocate_exception(0x20);
    pcVar4 = pcVar2;
    std::error_code::error_code<std::io_errc,void>
              (in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar4,(error_code *)"CustomUintFormatter value out of range");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(pcVar2,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, I v)
    {
        if (v < 0 || v > MAX) throw std::ios_base::failure("CustomUintFormatter value out of range");
        if (BigEndian) {
            uint64_t raw = htobe64_internal(v);
            s.write(AsBytes(Span{&raw, 1}).last(Bytes));
        } else {
            uint64_t raw = htole64_internal(v);
            s.write(AsBytes(Span{&raw, 1}).first(Bytes));
        }
    }